

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare
          (DebugInfoManager *this,Instruction *inst)

{
  CommonDebugInfoInstructions CVar1;
  uint32_t uVar2;
  OpenCLDebugInfo100Instructions OVar3;
  uint32_t uVar4;
  undefined8 in_RAX;
  iterator iVar5;
  Instruction *pIVar6;
  uint32_t local_28;
  uint32_t local_24;
  
  local_24 = (uint32_t)((ulong)in_RAX >> 0x20);
  CVar1 = Instruction::GetCommonDebugOpcode(inst);
  if (CVar1 == CommonDebugInfoDebugValue) {
    uVar2 = Instruction::GetSingleWordOperand(inst,6);
    _local_28 = CONCAT44(local_24,uVar2);
    iVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->id_to_dbg_inst_)._M_h,&local_28);
    if (((iVar5.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
          ._M_cur != (__node_type *)0x0) &&
        (pIVar6 = *(Instruction **)
                   ((long)iVar5.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                          ._M_cur + 0x10), pIVar6 != (Instruction *)0x0)) &&
       ((int)((ulong)((long)(pIVar6->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pIVar6->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 == 5)) {
      uVar2 = Instruction::GetSingleWordOperand(pIVar6,4);
      _local_28 = CONCAT44(uVar2,local_28);
      iVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->id_to_dbg_inst_)._M_h,&local_24);
      if ((iVar5.
           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
           ._M_cur != (__node_type *)0x0) &&
         (pIVar6 = *(Instruction **)
                    ((long)iVar5.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                           ._M_cur + 0x10), pIVar6 != (Instruction *)0x0)) {
        OVar3 = Instruction::GetOpenCL100DebugOpcode(inst);
        if (OVar3 == OpenCLDebugInfo100InstructionsMax) {
          uVar2 = GetVulkanDebugOperation(this,pIVar6);
        }
        else {
          uVar2 = Instruction::GetSingleWordOperand(pIVar6,4);
        }
        if (uVar2 == 0) {
          uVar2 = Instruction::GetSingleWordOperand(inst,5);
          if ((this->context_->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            __assert_fail("false && \"Checking a DebugValue can be used for declare needs DefUseManager\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                          ,0x28c,
                          "uint32_t spvtools::opt::analysis::DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare(Instruction *)"
                         );
          }
          pIVar6 = DefUseManager::GetDef
                             ((this->context_->def_use_mgr_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              .
                              super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                              ._M_head_impl,uVar2);
          if ((pIVar6->opcode_ == OpVariable) &&
             (uVar4 = Instruction::GetSingleWordOperand(pIVar6,2), uVar4 == 7)) {
            return uVar2;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

uint32_t DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare(
    Instruction* inst) {
  if (inst->GetCommonDebugOpcode() != CommonDebugInfoDebugValue) return 0;

  auto* expr =
      GetDbgInst(inst->GetSingleWordOperand(kDebugValueOperandExpressionIndex));
  if (expr == nullptr) return 0;
  if (expr->NumOperands() != kDebugExpressOperandOperationIndex + 1) return 0;

  auto* operation = GetDbgInst(
      expr->GetSingleWordOperand(kDebugExpressOperandOperationIndex));
  if (operation == nullptr) return 0;

  // OpenCL.DebugInfo.100 contains a literal for the operation, Vulkan uses an
  // OpConstant.
  if (inst->IsOpenCL100DebugInstr()) {
    if (operation->GetSingleWordOperand(kDebugOperationOperandOperationIndex) !=
        OpenCLDebugInfo100Deref) {
      return 0;
    }
  } else {
    uint32_t operation_const = GetVulkanDebugOperation(operation);
    if (operation_const != NonSemanticShaderDebugInfo100Deref) {
      return 0;
    }
  }

  uint32_t var_id =
      inst->GetSingleWordOperand(kDebugDeclareOperandVariableIndex);
  if (!context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse)) {
    assert(false &&
           "Checking a DebugValue can be used for declare needs DefUseManager");
    return 0;
  }

  auto* var = context()->get_def_use_mgr()->GetDef(var_id);
  if (var->opcode() == spv::Op::OpVariable &&
      spv::StorageClass(
          var->GetSingleWordOperand(kOpVariableOperandStorageClassIndex)) ==
          spv::StorageClass::Function) {
    return var_id;
  }
  return 0;
}